

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O3

int Int2_ManChainStart(Int2_Man_t *p,clause *c)

{
  clause cVar1;
  int iVar2;
  Gia_Man_t *p_00;
  clause iLit0;
  clause *pcVar3;
  clause cVar4;
  ulong uVar5;
  ulong uVar6;
  
  cVar4 = *c;
  if (((uint)cVar4 & 1) == 0) {
    if (((uint)cVar4 & 4) == 0) {
      return 1;
    }
    uVar5 = (ulong)((uint)cVar4 >> 0xb);
    if ((int)c[uVar5 + 1] < 0) {
      iLit0 = (clause)0x0;
      if (0x7ff < (uint)cVar4) {
        uVar6 = 0;
        iLit0 = (clause)0x0;
        do {
          cVar1 = c[uVar6 + 1];
          if ((int)cVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          if ((int)((uint)cVar1 >> 1) < p->vVar2Glo->nSize) {
            iVar2 = p->vVar2Glo->pArray[(uint)cVar1 >> 1];
            if (-1 < (long)iVar2) {
              p_00 = p->pGia;
              if (p_00->vCis->nSize <= iVar2) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar2 = p_00->vCis->pArray[iVar2];
              if ((iVar2 < 0) || (p_00->nObjs <= iVar2)) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              iLit0 = (clause)Gia_ManHashOr(p_00,(int)iLit0,((uint)cVar1 & 1) + iVar2 * 2);
              cVar4 = *c;
            }
          }
          uVar6 = uVar6 + 1;
          uVar5 = (ulong)((uint)cVar4 >> 0xb);
        } while (uVar6 < uVar5);
      }
      c[uVar5 + 1] = iLit0;
    }
    pcVar3 = c + uVar5 + 1;
  }
  else {
    pcVar3 = (clause *)((p->pSat->claProofs).ptr + (int)c[(ulong)((uint)cVar4 >> 0xb) + 1]);
  }
  return (int)*pcVar3;
}

Assistant:

int Int2_ManChainStart( Int2_Man_t * p, clause * c )
{
    if ( c->lrn )
        return veci_begin(&p->pSat->claProofs)[clause_id(c)];
    if ( !c->partA )
        return 1;
    if ( c->lits[c->size] < 0 )
    {
        int i, Var, CiId, Res = 0;
        for ( i = 0; i < (int)c->size; i++ )
        {
            // get ID of the global variable
            if ( Abc_Lit2Var(c->lits[i]) >= Vec_IntSize(p->vVar2Glo) )
                continue;
            Var = Vec_IntEntry( p->vVar2Glo, Abc_Lit2Var(c->lits[i]) );
            if ( Var < 0 )
                continue;
            // get literal of the AIG node
            CiId = Gia_ObjId( p->pGia, Gia_ManCi(p->pGia, Var) );
            // compute interpolant of the clause
            Res = Gia_ManHashOr( p->pGia, Res, Abc_Var2Lit(CiId, Abc_LitIsCompl(c->lits[i])) );
        }
        c->lits[c->size] = Res;
    }
    return c->lits[c->size];
}